

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::ConcurrentDatabase::get_hash_list_for_resource_tag
          (ConcurrentDatabase *this,ResourceTag tag,size_t *num_hashes,Hash *hashes)

{
  ExportedMetadataHeader *pEVar1;
  size_t sVar2;
  size_type sVar3;
  DatabaseInterface *pDVar4;
  _Hash_node_base *p_Var5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  Hash *pHVar9;
  ulong uVar10;
  size_t writeonly_size;
  long local_38;
  
  uVar7 = (ulong)tag;
  pEVar1 = ((this->super_DatabaseInterface).impl)->imported_concurrent_metadata;
  if (pEVar1 == (ExportedMetadataHeader *)0x0) {
    sVar3 = this->primed_hashes[uVar7]._M_h._M_element_count;
    local_38 = 0;
    pDVar4 = (this->writeonly_interface)._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if ((pDVar4 == (DatabaseInterface *)0x0) ||
       (iVar8 = (*pDVar4->_vptr_DatabaseInterface[6])(pDVar4,uVar7,&local_38,0), (char)iVar8 == '\0'
       )) {
      local_38 = 0;
    }
    uVar10 = sVar3 + local_38;
    if (hashes != (Hash *)0x0) {
      if (uVar10 != *num_hashes) {
        return uVar10 == *num_hashes;
      }
      pHVar9 = hashes;
      for (p_Var5 = this->primed_hashes[uVar7]._M_h._M_before_begin._M_nxt;
          p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
        *pHVar9 = (Hash)p_Var5[1]._M_nxt;
        pHVar9 = pHVar9 + 1;
      }
      if ((local_38 != 0) &&
         (pDVar4 = (this->writeonly_interface)._M_t.
                   super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                   .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl,
         iVar8 = (*pDVar4->_vptr_DatabaseInterface[6])(pDVar4,uVar7,&local_38,pHVar9),
         (char)iVar8 == '\0')) {
        return false;
      }
      if (uVar10 == 0) {
        return true;
      }
      lVar6 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::__introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (hashes,hashes + uVar10,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>
                (hashes,hashes + uVar10);
      return true;
    }
    *num_hashes = uVar10;
  }
  else {
    sVar2 = pEVar1->lists[uVar7].count;
    if (hashes == (Hash *)0x0) {
      *num_hashes = sVar2;
    }
    else {
      if (sVar2 != *num_hashes) {
        return sVar2 == *num_hashes;
      }
      memcpy(hashes,(void *)((long)&((ExportedMetadataHeader *)(pEVar1->lists + -1))->magic +
                            pEVar1->lists[uVar7].offset),sVar2 << 3);
    }
  }
  return true;
}

Assistant:

bool get_hash_list_for_resource_tag(ResourceTag tag, size_t *num_hashes, Hash *hashes) override
	{
		if (impl->imported_concurrent_metadata)
		{
			size_t total_size = impl->imported_concurrent_metadata->lists[tag].count;

			if (hashes)
			{
				if (total_size != *num_hashes)
					return false;
			}
			else
				*num_hashes = total_size;

			if (hashes)
			{
				memcpy(hashes,
				       reinterpret_cast<const uint8_t *>(impl->imported_concurrent_metadata) +
				       impl->imported_concurrent_metadata->lists[tag].offset,
				       total_size * sizeof(*hashes));
			}
			return true;
		}

		size_t readonly_size = primed_hashes[tag].size();

		size_t writeonly_size = 0;
		if (!writeonly_interface || !writeonly_interface->get_hash_list_for_resource_tag(tag, &writeonly_size, nullptr))
			writeonly_size = 0;

		size_t total_size = readonly_size + writeonly_size;

		if (hashes)
		{
			if (total_size != *num_hashes)
				return false;
		}
		else
			*num_hashes = total_size;

		if (hashes)
		{
			Hash *iter = hashes;
			for (auto &blob : primed_hashes[tag])
				*iter++ = blob;

			if (writeonly_size != 0 && !writeonly_interface->get_hash_list_for_resource_tag(tag, &writeonly_size, iter))
				return false;

			// Make replay more deterministic.
			sort(hashes, hashes + total_size);
		}

		return true;
	}